

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::SampleMaskUniqueCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  bool bVar1;
  ContextType ctxType;
  mapped_type *pmVar2;
  ostream *poVar3;
  NotSupportedError *this_00;
  key_type kStack_208;
  string local_1e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ostringstream buf;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  ctxType.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_208,"GLSL_VERSION_DECL",(allocator<char> *)&local_1e8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,&kStack_208);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&kStack_208);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_208,"GLSL_EXTENSION",(allocator<char> *)&local_1e8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,&kStack_208);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&kStack_208);
  if (numTargetSamples < 0x21) {
    poVar3 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                             "${GLSL_VERSION_DECL}\n${GLSL_EXTENSION}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tmediump int firstIndex = -1;\n\tfor (int i = 0; i < 32; ++i)\n\t{\n\t\tif (((gl_SampleMaskIn[0] >> i) & 0x01) == 0x01)\n\t\t{\n\t\t\tfirstIndex = i;\n\t\t\tbreak;\n\t\t}\n\t}\n\n\tbool notUniqueError = false;\n\tfor (int i = firstIndex + 1; i < 32; ++i)\n\t\tif (((gl_SampleMaskIn[0] >> i) & 0x01) == 0x01)\n\t\t\tnotUniqueError = true;\n\n\thighp float encodedSampleId = float(firstIndex) / "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,numTargetSamples);
    std::operator<<(poVar3,
                    ".0;\n\n\t// force per-sample shading\n\thighp float blue = float(gl_SampleID);\n\n\tif (notUniqueError)\n\t\tfragColor = vec4(1.0, 0.0, blue, 1.0);\n\telse\n\t\tfragColor = vec4(0.0, encodedSampleId, blue, 1.0);\n}\n"
                   );
    std::__cxx11::stringbuf::str();
    tcu::StringTemplate::StringTemplate((StringTemplate *)&kStack_208,&local_1e8);
    tcu::StringTemplate::specialize(__return_storage_ptr__,(StringTemplate *)&kStack_208,&args);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&kStack_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&args._M_t);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    return __return_storage_ptr__;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Sample count larger than 32 is not supported.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
             ,0x5c6);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string SampleMaskUniqueCase::genFragmentSource (int numTargetSamples) const
{
	DE_ASSERT(numTargetSamples != 0);

	std::ostringstream	buf;
	const bool			supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>	args;
	args["GLSL_VERSION_DECL"]	= supportsES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	args["GLSL_EXTENSION"]		= supportsES32 ? "" : "#extension GL_OES_sample_variables : require";

	// test supports only one sample mask word
	if (numTargetSamples > 32)
		TCU_THROW(NotSupportedError, "Sample count larger than 32 is not supported.");

	// find our sampleID by searching for unique bit.
	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXTENSION}\n"
			"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n"
			"	mediump int firstIndex = -1;\n"
			"	for (int i = 0; i < 32; ++i)\n"
			"	{\n"
			"		if (((gl_SampleMaskIn[0] >> i) & 0x01) == 0x01)\n"
			"		{\n"
			"			firstIndex = i;\n"
			"			break;\n"
			"		}\n"
			"	}\n"
			"\n"
			"	bool notUniqueError = false;\n"
			"	for (int i = firstIndex + 1; i < 32; ++i)\n"
			"		if (((gl_SampleMaskIn[0] >> i) & 0x01) == 0x01)\n"
			"			notUniqueError = true;\n"
			"\n"
			"	highp float encodedSampleId = float(firstIndex) / " << numTargetSamples <<".0;\n"
			"\n"
			"	// force per-sample shading\n"
			"	highp float blue = float(gl_SampleID);\n"
			"\n"
			"	if (notUniqueError)\n"
			"		fragColor = vec4(1.0, 0.0, blue, 1.0);\n"
			"	else\n"
			"		fragColor = vec4(0.0, encodedSampleId, blue, 1.0);\n"
			"}\n";

	return tcu::StringTemplate(buf.str()).specialize(args);
}